

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game-event.c
# Opt level: O2

void event_signal_bolt(game_event_type type,wchar_t proj_type,_Bool drawing,_Bool seen,_Bool beam,
                      wchar_t oy,wchar_t ox,wchar_t y,wchar_t x)

{
  game_event_data local_38;
  
  local_38.bolt.ox = ox;
  local_38.birthstage.n_choices = y;
  local_38.birthstage.initial_choice = x;
  local_38.point.x = proj_type;
  local_38.bolt.drawing = drawing;
  local_38.bolt.seen = seen;
  local_38.bolt.beam = beam;
  local_38.message.type = oy;
  game_event_dispatch(type,&local_38);
  return;
}

Assistant:

void event_signal_bolt(game_event_type type,
					   int proj_type,
					   bool drawing,
					   bool seen,
					   bool beam,
					   int oy,
					   int ox,
					   int y,
					   int x)
{
	game_event_data data;
	data.bolt.proj_type = proj_type;
	data.bolt.drawing = drawing;
	data.bolt.seen = seen;
	data.bolt.beam = beam;
	data.bolt.oy = oy;
	data.bolt.ox = ox;
	data.bolt.y = y;
	data.bolt.x = x;

	game_event_dispatch(type, &data);
}